

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::CheckIncompleteResult<vk::VkExtensionProperties>::~CheckIncompleteResult
          (CheckIncompleteResult<vk::VkExtensionProperties> *this)

{
  code *pcVar1;
  CheckIncompleteResult<vk::VkExtensionProperties> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void operator() (Context& context, tcu::ResultCollector& results, const std::size_t expectedCompleteSize)
	{
		if (expectedCompleteSize == 0)
			return;

		vector<T>		outputData	(expectedCompleteSize);
		const deUint32	usedSize	= static_cast<deUint32>(expectedCompleteSize / 3);

		ValidateQueryBits::fillBits(outputData.begin(), outputData.end());	// unused entries should have this pattern intact
		m_count		= usedSize;
		m_result	= VK_SUCCESS;

		getResult(context, &outputData[0]);									// update m_count and m_result

		if (m_count != usedSize || m_result != VK_INCOMPLETE || !ValidateQueryBits::checkBits(outputData.begin() + m_count, outputData.end()))
			results.fail("Query didn't return VK_INCOMPLETE");
	}